

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patcher.cpp
# Opt level: O1

void search_and_patch_r(string *indent,uint8_t *cstart,uint8_t *cend,pattern_t *pattern)

{
  uchar uVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last2;
  uchar *puVar2;
  pointer ppVar3;
  pointer pcVar4;
  char cVar5;
  uchar *__first1;
  ostream *poVar6;
  uchar *puVar7;
  uchar *puVar8;
  pointer ppVar9;
  byte bVar10;
  uchar uVar11;
  uint8_t wildcard;
  pattern_s child;
  uint8_t local_1ba;
  uchar local_1b9;
  pattern_t *local_1b8;
  int local_1ac;
  uchar *local_1a8;
  string local_1a0;
  vector<pattern_s,_std::allocator<pattern_s>_> *local_180;
  vector<pattern_s,_std::allocator<pattern_s>_> *local_178;
  pattern_s local_170;
  pattern_s local_d0;
  
  local_1ba = pattern->wildcard;
  local_1b9 = pattern->replace_wildcard;
  local_180 = &local_d0.childs;
  local_178 = &local_170.childs;
  local_1ac = 0;
  local_1b8 = pattern;
  local_1a8 = cend;
  do {
    puVar7 = local_1a8;
    __first1 = std::
               search<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,search_and_patch_r(std::__cxx11::string,unsigned_char*,unsigned_char*,pattern_s)::__0>
                         (cstart,local_1a8,
                          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )(pattern->patt).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )(pattern->patt).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                          (anon_class_8_1_a2015b58)&local_1ba);
    if (__first1 < puVar7) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Found <",7);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(pattern->name)._M_dataplus._M_p,(pattern->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"> at 0x",7);
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      __first2._M_current =
           (pattern->validate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      __last2._M_current =
           (pattern->validate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__first2._M_current == __last2._M_current) {
        bVar10 = 1;
      }
      else {
        puVar7 = std::
                 search<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,search_and_patch_r(std::__cxx11::string,unsigned_char*,unsigned_char*,pattern_s)::__0>
                           (__first1,__first1 +
                                     (long)(__last2._M_current + (5 - (long)__first2._M_current)),
                            __first2,__last2,(anon_class_8_1_a2015b58)&local_1ba);
        bVar10 = puVar7 < __first1 + (long)(__last2._M_current + (5 - (long)__first2._M_current)) |
                 force_invalid;
      }
      if ((local_1b8->replace).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (local_1b8->replace).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,
                            indent->_M_string_length);
        cVar5 = (char)poVar6;
        if ((bVar10 & 1) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     "Can\'t apply patch! (search region don\'t pass validation), use -force_invalid to force."
                     ,0x56);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Patching...",0xb);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          puVar7 = (local_1b8->replace).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar2 = (local_1b8->replace).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (puVar7 != puVar2) {
            puVar8 = __first1 + local_1b8->replace_offset;
            do {
              uVar1 = *puVar7;
              uVar11 = *puVar8;
              if (local_1b9 != uVar1) {
                uVar11 = uVar1;
              }
              if (local_1b9 == '\0') {
                uVar11 = uVar1;
              }
              *puVar8 = uVar11;
              puVar7 = puVar7 + 1;
              puVar8 = puVar8 + 1;
            } while (puVar7 != puVar2);
          }
        }
      }
      ppVar3 = (local_1b8->childs).super__Vector_base<pattern_s,_std::allocator<pattern_s>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (ppVar9 = (local_1b8->childs).super__Vector_base<pattern_s,_std::allocator<pattern_s>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar3; ppVar9 = ppVar9 + 1)
      {
        pattern_s::pattern_s(&local_170,ppVar9);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,
                            indent->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Scanning SUB:<",0xe);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_170.name._M_dataplus._M_p,local_170.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,">",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        puVar7 = __first1 + local_170.max_search;
        if (local_170.max_search == 0) {
          puVar7 = local_1a8;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (indent,"...");
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        pcVar4 = (indent->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a0,pcVar4,pcVar4 + indent->_M_string_length);
        pattern_s::pattern_s(&local_d0,&local_170);
        search_and_patch_r(&local_1a0,__first1,puVar7,&local_d0);
        std::vector<pattern_s,_std::allocator<pattern_s>_>::~vector(local_180);
        if (local_d0.validate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.validate.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.validate.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.validate.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.replace.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.replace.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.replace.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.replace.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.patt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.patt.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.patt.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.patt.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.name._M_dataplus._M_p != &local_d0.name.field_2) {
          operator_delete(local_d0.name._M_dataplus._M_p,
                          local_d0.name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        std::vector<pattern_s,_std::allocator<pattern_s>_>::~vector(local_178);
        if (local_170.validate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.validate.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_170.validate.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.validate.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_170.replace.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.replace.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_170.replace.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.replace.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_170.patt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.patt.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_170.patt.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.patt.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170.name._M_dataplus._M_p != &local_170.name.field_2) {
          operator_delete(local_170.name._M_dataplus._M_p,
                          local_170.name.field_2._M_allocated_capacity + 1);
        }
      }
      local_1ac = local_1ac + 1;
      cstart = __first1 +
               ((long)(local_1b8->patt).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(local_1b8->patt).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
      pattern = local_1b8;
    }
    else if (local_1ac == 0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Warning: <",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(pattern->name)._M_dataplus._M_p,(pattern->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"> was not found!",0x10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  } while (__first1 < local_1a8);
  return;
}

Assistant:

void search_and_patch_r(string indent, uint8_t* cstart, uint8_t* cend, pattern_t pattern)
{
    const uint8_t wildcard = pattern.wildcard;
    const uint8_t replace_wildcard = pattern.replace_wildcard;
    auto comparer = [&wildcard](uint8_t val1, uint8_t val2)
    {
        return (val1 == val2 || (wildcard && val2 == wildcard));
    };
    auto comparer2 = [&replace_wildcard](uint8_t val, uint8_t val2)
    {
        if (!replace_wildcard)
            return val;
        else if (val == replace_wildcard)
        {
            return val2;
        }

        return val;
    };
    int found = 0;
    for (;;)
    {
        uint8_t* res = std::search(cstart, cend, pattern.patt.begin(), pattern.patt.end(), comparer);
        if (res >= cend)
        {
            if(!found)
                std::cout << indent << "Warning: <" << pattern.name << "> was not found!" << std::endl;
            break;
        }
        found++;
        std::cout << indent << "Found <" << pattern.name << "> at 0x" << std::hex << (res-cstart) << std::endl;
        bool patch = true;
        if (!pattern.validate.empty())
        {
            auto found = std::search(res, res + pattern.validate.size() + 5, pattern.validate.begin(), pattern.validate.end(), comparer);
            if (found >= res + pattern.validate.size() + 5)
            {
                patch = force_invalid;
            }
        }
        if (!pattern.replace.empty())
        {
            if (patch)
            {
                std::cout << indent << "Patching..." << std::endl;
                std::transform(pattern.replace.begin(), pattern.replace.end(), res + pattern.replace_offset, res + pattern.replace_offset, comparer2);
            }
            else
            {
                std::cout << indent << "Can't apply patch! (search region don't pass validation), use -force_invalid to force." << std::endl;
            }
        }
        if (!pattern.childs.empty())
        {
            for (auto child : pattern.childs)
            {
                std::cout << indent << "Scanning SUB:<" << child.name << ">" << std::endl;
                auto end = child.max_search ? res + child.max_search : cend;
                indent += "...";
                search_and_patch_r(indent, res, end, child);
            }
        }
        cstart = res + pattern.patt.size();
    }
}